

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  float fVar1;
  char cVar2;
  uint *puVar3;
  ImDrawVert *pIVar4;
  char *pcVar5;
  size_t sVar6;
  void *pvVar7;
  char *pcVar8;
  ImFontGlyph *pIVar9;
  ImDrawCmd *pIVar10;
  int iVar11;
  char *pcVar12;
  char *in_text;
  uint uVar13;
  char *text_end_00;
  int iVar14;
  float scale;
  float fVar15;
  float fVar16;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float local_b0;
  uint c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  ulong local_60;
  uint *local_58;
  ImDrawVert *local_50;
  int local_44;
  int local_40;
  ImU32 local_3c;
  char *local_38;
  
  local_78._0_4_ = pos.x;
  local_78._4_4_ = pos.y;
  local_3c = col;
  if (text_end == (char *)0x0) {
    fStack_70 = in_XMM1_Dc;
    local_78 = (undefined1  [8])pos;
    fStack_6c = in_XMM1_Dd;
    sVar6 = strlen(text_begin);
    text_end = text_begin + sVar6;
    in_XMM1_Dc = fStack_70;
    in_XMM1_Dd = fStack_6c;
  }
  fVar17 = (float)(int)((float)local_78._4_4_ + (this->DisplayOffset).y);
  fVar19 = clip_rect->w;
  if (fVar17 <= fVar19) {
    local_78._0_4_ = (float)local_78._0_4_ + (this->DisplayOffset).x;
    fStack_70 = in_XMM1_Dc;
    fStack_6c = in_XMM1_Dd;
    scale = size / this->FontSize;
    fVar15 = this->FontSize * scale;
    if ((wrap_width <= 0.0) && (fVar18 = clip_rect->y, fVar17 + fVar15 < fVar18)) {
      while ((fVar16 = fVar15 + fVar17, fVar16 < fVar18 && (text_begin < text_end))) {
        pvVar7 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar7 + 1);
        fVar17 = fVar16;
        if (pvVar7 == (void *)0x0) {
          text_begin = text_end;
        }
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar8 = text_begin, fVar18 = fVar17, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar8, fVar18 < fVar19 && (pcVar8 < text_end))) {
        pvVar7 = memchr(pcVar8,10,(long)text_end - (long)pcVar8);
        pcVar8 = (char *)((long)pvVar7 + 1);
        if (pvVar7 == (void *)0x0) {
          pcVar8 = text_end;
        }
        fVar18 = fVar18 + fVar15;
      }
    }
    if (text_begin != text_end_00) {
      local_78._4_4_ = (float)(int)(float)local_78._4_4_;
      local_78._0_4_ = (float)(int)(float)local_78._0_4_;
      fStack_70 = (float)(int)fStack_70;
      fStack_6c = (float)(int)fStack_6c;
      iVar11 = (int)text_end_00 - (int)text_begin;
      local_40 = iVar11 * 6;
      local_44 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_40,iVar11 * 4);
      local_50 = draw_list->_VtxWritePtr;
      local_58 = draw_list->_IdxWritePtr;
      local_60 = (ulong)draw_list->_VtxCurrentIdx;
      local_38 = (char *)0x0;
      local_b0 = (float)local_78._0_4_;
      pcVar8 = local_38;
      fVar18 = (float)local_78._0_4_;
      fVar19 = (float)local_78._0_4_;
      fVar16 = fVar17;
      pcVar12 = text_begin;
LAB_0014dba1:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar12;
        fVar25 = fVar16;
        fVar1 = local_b0;
        pcVar5 = local_38;
        if (0.0 < wrap_width) {
          if (pcVar8 == (char *)0x0) {
            pcVar8 = CalcWordWrapPositionA
                               (this,scale,text_begin,text_end_00,(fVar18 - fVar19) + wrap_width);
            pcVar8 = pcVar8 + (pcVar8 == text_begin);
            fVar18 = (float)local_78._0_4_;
          }
          in_text = text_begin;
          fVar25 = fVar17;
          fVar1 = fVar19;
          pcVar5 = pcVar8;
          if (pcVar8 <= text_begin) {
            fVar17 = fVar17 + fVar15;
            do {
              pcVar8 = text_begin;
              text_begin = pcVar8;
              if (text_end_00 <= pcVar8) goto LAB_0014dc48;
              cVar2 = *pcVar8;
              text_begin = pcVar8 + 1;
            } while ((cVar2 == '\t') || (cVar2 == ' '));
            text_begin = pcVar8 + 1;
            if (cVar2 != '\n') {
              text_begin = pcVar8;
            }
LAB_0014dc48:
            pcVar8 = (char *)0x0;
            fVar19 = fVar18;
            goto LAB_0014dba1;
          }
        }
        local_38 = pcVar5;
        local_b0 = fVar1;
        fVar17 = fVar25;
        c = (uint)*in_text;
        if (*in_text < '\0') {
          iVar11 = ImTextCharFromUtf8(&c,in_text,text_end_00);
          if (c == 0) break;
          text_begin = in_text + iVar11;
          fVar19 = (float)local_78._0_4_;
        }
        else {
          text_begin = in_text + 1;
          fVar19 = fVar18;
        }
        fVar16 = fVar17;
        pcVar12 = text_begin;
        if (0x1f < c) {
LAB_0014dce1:
          pIVar9 = FindGlyph(this,(ImWchar)c);
          if (pIVar9 != (ImFontGlyph *)0x0) {
            fVar19 = pIVar9->AdvanceX;
            if (*(int *)pIVar9 < 0) {
              fVar25 = pIVar9->X0 * scale + local_b0;
              fVar18 = clip_rect->z;
              if (fVar25 <= fVar18) {
                fVar26 = pIVar9->X1 * scale + local_b0;
                fVar1 = clip_rect->x;
                if (fVar1 <= fVar26) {
                  fVar27 = pIVar9->Y0 * scale + fVar17;
                  fVar22 = pIVar9->Y1 * scale + fVar17;
                  fVar20 = pIVar9->U0;
                  fVar24 = pIVar9->V0;
                  fVar23 = pIVar9->U1;
                  fVar21 = pIVar9->V1;
                  if (cpu_fine_clip) {
                    if (fVar25 < fVar1) {
                      fVar20 = fVar20 + (fVar23 - fVar20) *
                                        (1.0 - (fVar26 - fVar1) / (fVar26 - fVar25));
                      fVar25 = fVar1;
                    }
                    fVar1 = clip_rect->y;
                    if (fVar27 < fVar1) {
                      fVar24 = fVar24 + (fVar21 - fVar24) *
                                        (1.0 - (fVar22 - fVar1) / (fVar22 - fVar27));
                      fVar27 = fVar1;
                    }
                    if (fVar18 < fVar26) {
                      fVar23 = (fVar23 - fVar20) * ((fVar18 - fVar25) / (fVar26 - fVar25)) + fVar20;
                      fVar26 = fVar18;
                    }
                    fVar18 = clip_rect->w;
                    if (fVar18 < fVar22) {
                      fVar21 = (fVar21 - fVar24) * ((fVar18 - fVar27) / (fVar22 - fVar27)) + fVar24;
                      fVar22 = fVar18;
                    }
                    if (fVar22 <= fVar27) goto LAB_0014dd21;
                  }
                  uVar13 = (uint)local_60;
                  *local_58 = uVar13;
                  local_58[1] = uVar13 + 1;
                  local_58[2] = uVar13 + 2;
                  local_58[3] = uVar13;
                  local_58[4] = uVar13 + 2;
                  local_58[5] = uVar13 + 3;
                  (local_50->pos).x = fVar25;
                  (local_50->pos).y = fVar27;
                  local_50->col = local_3c;
                  (local_50->uv).x = fVar20;
                  (local_50->uv).y = fVar24;
                  local_50[1].pos.x = fVar26;
                  local_50[1].pos.y = fVar27;
                  local_50[1].col = local_3c;
                  local_50[1].uv.x = fVar23;
                  local_50[1].uv.y = fVar24;
                  local_50[2].pos.x = fVar26;
                  local_50[2].pos.y = fVar22;
                  local_50[2].col = local_3c;
                  local_50[2].uv.x = fVar23;
                  local_50[2].uv.y = fVar21;
                  local_50[3].pos.x = fVar25;
                  local_50[3].pos.y = fVar22;
                  local_50[3].col = local_3c;
                  local_50[3].uv.x = fVar20;
                  local_50[3].uv.y = fVar21;
                  local_50 = local_50 + 4;
                  local_60 = (ulong)(uVar13 + 4);
                  local_58 = local_58 + 6;
                }
              }
            }
LAB_0014dd21:
            local_b0 = local_b0 + fVar19 * scale;
          }
          pcVar8 = local_38;
          fVar18 = (float)local_78._0_4_;
          fVar19 = local_b0;
          goto LAB_0014dba1;
        }
        pcVar8 = local_38;
        fVar18 = fVar19;
        if (c != 10) {
          fVar19 = local_b0;
          if (c != 0xd) goto LAB_0014dce1;
          goto LAB_0014dba1;
        }
        fVar17 = fVar17 + fVar15;
        local_b0 = fVar19;
        fVar16 = fVar17;
      } while (fVar17 < clip_rect->w || fVar17 == clip_rect->w);
      pIVar4 = local_50;
      puVar3 = local_58;
      (draw_list->VtxBuffer).Size =
           (int)(((long)local_50 - (long)(draw_list->VtxBuffer).Data) / 0x14);
      iVar14 = (int)((ulong)((long)local_58 - (long)(draw_list->IdxBuffer).Data) >> 2);
      (draw_list->IdxBuffer).Size = iVar14;
      iVar11 = local_44 + local_40;
      pIVar10 = ImVector<ImDrawCmd>::operator[]
                          (&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + -1);
      pIVar10->ElemCount = pIVar10->ElemCount + (iVar14 - iVar11);
      draw_list->_VtxWritePtr = pIVar4;
      draw_list->_IdxWritePtr = puVar3;
      draw_list->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x + DisplayOffset.x);
    pos.y = IM_FLOOR(pos.y + DisplayOffset.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}